

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_generated_dispatch.c
# Opt level: O0

PFNGLTEXTURESTORAGE3DPROC epoxy_glTextureStorage3D_resolver(void)

{
  PFNGLTEXTURESTORAGE3DPROC p_Var1;
  
  p_Var1 = (PFNGLTEXTURESTORAGE3DPROC)
           gl_provider_resolver
                     ("glTextureStorage3D",epoxy_glTextureStorage3D_resolver::providers,
                      epoxy_glTextureStorage3D_resolver::entrypoints);
  return p_Var1;
}

Assistant:

static PFNGLTEXTURESTORAGE3DPROC
epoxy_glTextureStorage3D_resolver(void)
{
    static const enum gl_provider providers[] = {
        Desktop_OpenGL_4_5,
        GL_extension_GL_ARB_direct_state_access,
        gl_provider_terminator
    };
    static const uint32_t entrypoints[] = {
        52831 /* "glTextureStorage3D" */,
        52831 /* "glTextureStorage3D" */,
    };
    return gl_provider_resolver(entrypoint_strings + 52831 /* "glTextureStorage3D" */,
                                providers, entrypoints);
}